

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QMDP.cpp
# Opt level: O1

double __thiscall QMDP::GetQNoCache(QMDP *this,Index jaohI,Index jaI)

{
  Index IVar1;
  PlanningUnitMADPDiscrete *pPVar2;
  JointBeliefInterface *pJVar3;
  double extraout_XMM0_Qa;
  double dVar4;
  
  pPVar2 = (PlanningUnitMADPDiscrete *)
           (**(code **)(*(long *)(&this->field_0x0 + *(long *)(*(long *)this + -0xa0)) + 0x60))
                     (&this->field_0x0 + *(long *)(*(long *)this + -0xa0));
  IVar1 = PlanningUnitMADPDiscrete::GetTimeStepForJAOHI(pPVar2,(ulong)jaohI);
  pPVar2 = (PlanningUnitMADPDiscrete *)
           (**(code **)(*(long *)(&this->field_0x0 + *(long *)(*(long *)this + -0xa0)) + 0x60))
                     (&this->field_0x0 + *(long *)(*(long *)this + -0xa0));
  dVar4 = extraout_XMM0_Qa;
  pJVar3 = PlanningUnitMADPDiscrete::GetJointBeliefInterface(pPVar2,(ulong)jaohI);
  (*this->_m_p->_vptr_MDPSolver[7])(this->_m_p,(ulong)IVar1,pJVar3,(ulong)jaI);
  if (pJVar3 != (JointBeliefInterface *)0x0) {
    (**(code **)((long)*pJVar3 + 8))(pJVar3);
  }
  return dVar4;
}

Assistant:

double QMDP::GetQNoCache(Index jaohI, Index jaI) const
{
    Index t = GetPU()->GetTimeStepForJAOHI(jaohI);
    JointBeliefInterface * jb = GetPU()->GetJointBeliefInterface(jaohI);
    double q = _m_p->GetQ (t, *jb, jaI);
    delete jb;
    return( q );
}